

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Connection::serverCheckClientPreface(QHttp2Connection *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  QIODevice *pQVar2;
  long lVar3;
  QHttp2Connection *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QIODevice *socket;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  char *str;
  undefined1 in_stack_ffffffffffffff58 [16];
  QHttp2Connection *message;
  Http2Error in_stack_ffffffffffffff7c;
  QHttp2Connection *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char local_60 [56];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_waitingForClientPreface & 1U) == 0) {
    bVar1 = true;
  }
  else {
    message = in_RDI;
    pQVar2 = getSocket((QHttp2Connection *)0x2b62e8);
    lVar3 = (**(code **)(*(long *)pQVar2 + 0xa0))();
    if (lVar3 < 0x18) {
      bVar1 = false;
    }
    else {
      bVar1 = readClientPreface(in_stack_ffffffffffffff58._8_8_);
      str = in_stack_ffffffffffffff58._0_8_;
      if (bVar1) {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        local_20 = 0xaaaaaaaaaaaaaaaa;
        qHttp2ConnectionLog();
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                   (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                  );
        while( true ) {
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_28);
          if (!bVar1) break;
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b645d);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_,
                     (int)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (char *)0x2b6473);
          QMessageLogger::debug
                    (&stack0xffffffffffffff80,"[%p] Peer sent valid client preface",in_RDI);
          local_20 = local_20 & 0xffffffffffffff00;
        }
        in_RDI->m_waitingForClientPreface = false;
        bVar1 = sendServerPreface(in_RDI);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          connectionError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(char *)message);
          bVar1 = false;
        }
      }
      else {
        (**(code **)(*(long *)pQVar2 + 0x70))();
        QVar4 = Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_RDI);
        latin1.m_data = in_stack_ffffffffffffff88;
        latin1.m_size = (qsizetype)in_stack_ffffffffffffff80;
        QString::QString((QString *)QVar4.m_data,latin1);
        errorOccurred(in_RDI,QVar4.m_size._4_4_,
                      (QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        QString::~QString((QString *)0x2b6375);
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        qHttp2ConnectionLog();
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                   (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                  );
        while( true ) {
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_18);
          if (!bVar1) break;
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b63c8);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)QVar4.m_data,(char *)QVar4.m_size,
                     (int)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (char *)0x2b63de);
          QMessageLogger::debug(local_60,"[%p] Invalid client preface",in_RDI);
          local_10 = local_10 & 0xffffffffffffff00;
        }
        bVar1 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::serverCheckClientPreface()
{
    if (!m_waitingForClientPreface)
        return true;
    auto *socket = getSocket();
    if (socket->bytesAvailable() < Http2::clientPrefaceLength)
        return false;
    if (!readClientPreface()) {
        socket->close();
        emit errorOccurred(Http2Error::PROTOCOL_ERROR, "invalid client preface"_L1);
        qCDebug(qHttp2ConnectionLog, "[%p] Invalid client preface", this);
        return false;
    }
    qCDebug(qHttp2ConnectionLog, "[%p] Peer sent valid client preface", this);
    m_waitingForClientPreface = false;
    if (!sendServerPreface()) {
        connectionError(INTERNAL_ERROR, "Failed to send server preface");
        return false;
    }
    return true;
}